

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O0

int32 float64_to_int32_round_to_zero(float64 a)

{
  int16 iVar1;
  bits64 bVar2;
  ulong uVar3;
  byte bVar4;
  int local_34;
  int32 z;
  bits64 savedASig;
  bits64 aSig;
  int16 shiftCount;
  int16 aExp;
  flag aSign;
  float64 a_local;
  
  bVar2 = extractFloat64Frac(a);
  iVar1 = extractFloat64Exp(a);
  aSig._7_1_ = extractFloat64Sign(a);
  if (iVar1 < 0x41f) {
    if (iVar1 < 0x3ff) {
      if ((iVar1 != 0) || (bVar2 != 0)) {
        float_exception_flags = float_exception_flags | 0x20;
      }
      return 0;
    }
    bVar4 = 0x33 - (char)iVar1;
    uVar3 = (bVar2 | 0x10000000000000) >> (bVar4 & 0x3f);
    local_34 = (int)uVar3;
    if (aSig._7_1_ != '\0') {
      local_34 = -local_34;
    }
    if ((uint)(local_34 < 0) == (int)aSig._7_1_) {
      if (uVar3 << (bVar4 & 0x3f) != (bVar2 | 0x10000000000000)) {
        float_exception_flags = float_exception_flags | 0x20;
      }
      return local_34;
    }
  }
  else if ((iVar1 == 0x7ff) && (bVar2 != 0)) {
    aSig._7_1_ = '\0';
  }
  float_raise('\x01');
  a_local._4_4_ = 0x7fffffff;
  if (aSig._7_1_ != '\0') {
    a_local._4_4_ = -0x80000000;
  }
  return a_local._4_4_;
}

Assistant:

int32 float64_to_int32_round_to_zero( float64 a )
{
	flag aSign;
	int16 aExp, shiftCount;
	bits64 aSig, savedASig;
	int32 z;

	aSig = extractFloat64Frac( a );
	aExp = extractFloat64Exp( a );
	aSign = extractFloat64Sign( a );
	if ( 0x41E < aExp ) {
		if ( ( aExp == 0x7FF ) && aSig ) aSign = 0;
		goto invalid;
	}
	else if ( aExp < 0x3FF ) {
		if ( aExp || aSig ) float_exception_flags |= float_flag_inexact;
		return 0;
	}
	aSig |= LIT64( 0x0010000000000000 );
	shiftCount = 0x433 - aExp;
	savedASig = aSig;
	aSig >>= shiftCount;
	z = aSig;
	if ( aSign ) z = - z;
	if ( ( z < 0 ) ^ aSign ) {
	invalid:
		float_raise( float_flag_invalid );
		return aSign ? (sbits32) 0x80000000 : 0x7FFFFFFF;
	}
	if ( ( aSig<<shiftCount ) != savedASig ) {
		float_exception_flags |= float_flag_inexact;
	}
	return z;

}